

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verFormula.c
# Opt level: O3

Hop_Obj_t * Ver_FormulaParserTopOper(Hop_Man_t *pMan,Vec_Ptr_t *vStackFn,int Oper)

{
  int iVar1;
  Hop_Obj_t *p0;
  uint uVar2;
  Hop_Obj_t *pHVar3;
  void **ppvVar4;
  
  iVar1 = vStackFn->nSize;
  if (0 < iVar1) {
    ppvVar4 = vStackFn->pArray;
    uVar2 = iVar1 - 1;
    vStackFn->nSize = uVar2;
    if (uVar2 != 0) {
      pHVar3 = (Hop_Obj_t *)ppvVar4[uVar2];
      uVar2 = iVar1 - 2;
      vStackFn->nSize = uVar2;
      if (Oper - 2U < 5) {
        p0 = (Hop_Obj_t *)ppvVar4[uVar2];
        switch(Oper) {
        case 2:
          if (uVar2 == 0) goto LAB_0085e8e8;
          vStackFn->nSize = iVar1 - 3U;
          pHVar3 = Hop_Mux(pMan,(Hop_Obj_t *)ppvVar4[iVar1 - 3U],p0,pHVar3);
          break;
        case 3:
          pHVar3 = Hop_Exor(pMan,p0,pHVar3);
          pHVar3 = (Hop_Obj_t *)((ulong)pHVar3 ^ 1);
          break;
        case 4:
          pHVar3 = Hop_Or(pMan,p0,pHVar3);
          break;
        case 5:
          pHVar3 = Hop_Exor(pMan,p0,pHVar3);
          break;
        case 6:
          pHVar3 = Hop_And(pMan,p0,pHVar3);
        }
        uVar2 = vStackFn->nSize;
        if (uVar2 == vStackFn->nCap) {
          if ((int)uVar2 < 0x10) {
            if (vStackFn->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(vStackFn->pArray,0x80);
            }
            vStackFn->pArray = ppvVar4;
            vStackFn->nCap = 0x10;
          }
          else {
            if (vStackFn->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(vStackFn->pArray,(ulong)uVar2 << 4);
            }
            vStackFn->pArray = ppvVar4;
            vStackFn->nCap = uVar2 * 2;
          }
        }
        else {
          ppvVar4 = vStackFn->pArray;
        }
        iVar1 = vStackFn->nSize;
        vStackFn->nSize = iVar1 + 1;
        ppvVar4[iVar1] = pHVar3;
      }
      else {
        pHVar3 = (Hop_Obj_t *)0x0;
      }
      return pHVar3;
    }
  }
LAB_0085e8e8:
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
}

Assistant:

Hop_Obj_t * Ver_FormulaParserTopOper( Hop_Man_t * pMan, Vec_Ptr_t * vStackFn, int Oper )
{
    Hop_Obj_t * bArg0, * bArg1, * bArg2, * bFunc;
    // perform the given operation
    bArg2 = (Hop_Obj_t *)Vec_PtrPop( vStackFn );
    bArg1 = (Hop_Obj_t *)Vec_PtrPop( vStackFn );
    if ( Oper == VER_PARSE_OPER_AND )
        bFunc = Hop_And( pMan, bArg1, bArg2 );
    else if ( Oper == VER_PARSE_OPER_XOR )
        bFunc = Hop_Exor( pMan, bArg1, bArg2 );
    else if ( Oper == VER_PARSE_OPER_OR )
        bFunc = Hop_Or( pMan, bArg1, bArg2 );
    else if ( Oper == VER_PARSE_OPER_EQU )
        bFunc = Hop_Not( Hop_Exor( pMan, bArg1, bArg2 ) );
    else if ( Oper == VER_PARSE_OPER_MUX )
    {
        bArg0 = (Hop_Obj_t *)Vec_PtrPop( vStackFn );
//        bFunc = Cudd_bddIte( dd, bArg0, bArg1, bArg2 );  Cudd_Ref( bFunc );
        bFunc = Hop_Mux( pMan, bArg0, bArg1, bArg2 ); 
//        Cudd_RecursiveDeref( dd, bArg0 );
//        Cudd_Deref( bFunc );
    }
    else
        return NULL;
//    Cudd_Ref( bFunc );
//    Cudd_RecursiveDeref( dd, bArg1 );
//    Cudd_RecursiveDeref( dd, bArg2 );
    Vec_PtrPush( vStackFn,  bFunc );
    return bFunc;
}